

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_meshb_cell(REF_CELL ref_cell,REF_LONG ncell,REF_NODE ref_node,REF_LONG nnode,
                   REF_INT version,REF_BOOL pad,FILE *file)

{
  uint uVar1;
  REF_MPI ref_mpi;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  int *piVar8;
  void *pvVar9;
  long *plVar10;
  REF_INT *pRVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  int iVar18;
  size_t sVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  REF_INT *pRVar23;
  REF_GLOB *pRVar24;
  long lVar25;
  REF_STATUS RVar26;
  int iVar27;
  uint uVar28;
  REF_LONG ref_private_status_reis_ai_1;
  size_t sVar29;
  long lVar30;
  bool bVar31;
  REF_INT elements_to_receive;
  REF_INT end_of_message;
  REF_LONG ref_private_status_reis_ai;
  REF_INT zero;
  REF_STATUS local_140;
  int local_10c;
  int *local_108;
  ulong local_100;
  long *local_f8;
  REF_INT *local_f0;
  REF_GLOB *local_e8;
  ulong local_e0;
  void *local_d8;
  uint *local_d0;
  void *local_c8;
  ulong local_c0;
  REF_NODE local_b8;
  int local_ac;
  REF_INT *local_a8;
  ulong local_a0;
  REF_CELL local_98;
  void *local_90;
  long local_88;
  long local_80;
  int local_78;
  REF_INT local_74;
  size_t local_70;
  REF_LONG local_68;
  ulong local_60;
  long *local_58;
  long local_50;
  long local_48;
  long local_40;
  undefined1 local_34 [4];
  
  ref_mpi = ref_node->ref_mpi;
  local_ac = -1;
  iVar18 = ref_mpi->n;
  uVar3 = ncell / (long)iVar18;
  uVar22 = 1000000;
  if (1000000 < (long)uVar3) {
    uVar22 = uVar3;
  }
  uVar2 = ref_cell->size_per * (int)uVar22;
  if ((int)uVar2 < 0) {
    pcVar21 = "malloc sent_c2n of REF_GLOB negative";
    uVar17 = 0x1b4;
LAB_0015b502:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17,
           "ref_part_meshb_cell",pcVar21);
    RVar26 = 1;
  }
  else {
    uVar1 = ref_cell->node_per;
    sVar29 = (ulong)uVar2 << 3;
    local_e0 = (long)ref_cell->size_per;
    local_98 = ref_cell;
    local_74 = version;
    local_68 = ncell;
    local_60 = uVar22;
    local_e8 = (REF_GLOB *)malloc(sVar29);
    uVar22 = local_e0;
    if (local_e8 == (REF_GLOB *)0x0) {
      pcVar21 = "malloc sent_c2n of REF_GLOB NULL";
      uVar17 = 0x1b4;
    }
    else {
      local_100 = local_e0 & 0xffffffff;
      local_b8 = ref_node;
      if (ref_mpi->id != 0) {
        local_e0 = local_e0 << 2;
        do {
          uVar2 = ref_mpi_scatter_recv(ref_mpi,&local_10c,1,1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x23f,"ref_part_meshb_cell",(ulong)uVar2,"recv");
            return uVar2;
          }
          if (0 < local_10c) {
            uVar2 = ref_mpi_scatter_recv(ref_mpi,local_e8,local_10c * (int)local_100,2);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x243,"ref_part_meshb_cell",(ulong)uVar2,"send");
              return uVar2;
            }
            uVar2 = local_10c * (int)local_100;
            if ((int)uVar2 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x246,"ref_part_meshb_cell","malloc sent_part of REF_INT negative");
              bVar31 = false;
              local_140 = 1;
            }
            else {
              local_f0 = (REF_INT *)malloc((ulong)uVar2 * 4);
              if (local_f0 == (REF_INT *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x246,"ref_part_meshb_cell","malloc sent_part of REF_INT NULL");
                bVar31 = false;
                local_140 = 2;
                local_f0 = (REF_INT *)0x0;
                ref_node = local_b8;
              }
              else {
                if (uVar2 != 0) {
                  memset(local_f0,0xff,(ulong)uVar2 << 2);
                }
                bVar31 = true;
                ref_node = local_b8;
              }
            }
            pRVar11 = local_f0;
            if (!bVar31) {
              return local_140;
            }
            if (0 < local_10c) {
              lVar25 = 0;
              pRVar23 = local_f0;
              pRVar24 = local_e8;
              do {
                if (0 < (int)uVar1) {
                  uVar3 = 0;
                  do {
                    lVar30 = (long)ref_mpi->n;
                    lVar4 = (nnode + -1 + lVar30) / lVar30;
                    lVar5 = pRVar24[uVar3] / lVar4;
                    lVar6 = (nnode + -1) / lVar30;
                    lVar30 = nnode - lVar30 * lVar6;
                    if (lVar30 <= lVar5) {
                      lVar5 = (pRVar24[uVar3] - lVar4 * lVar30) / lVar6 + lVar30;
                    }
                    pRVar23[uVar3] = (REF_INT)lVar5;
                    uVar3 = uVar3 + 1;
                  } while (uVar1 != uVar3);
                }
                lVar25 = lVar25 + 1;
                pRVar24 = pRVar24 + uVar22;
                pRVar23 = (REF_INT *)((long)pRVar23 + local_e0);
                ref_node = local_b8;
              } while (lVar25 < local_10c);
            }
            uVar2 = ref_cell_add_many_global
                              (local_98,ref_node,local_10c,local_e8,local_f0,ref_mpi->id);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x250,"ref_part_meshb_cell",(ulong)uVar2,"many glob");
              return uVar2;
            }
            if (pRVar11 == (REF_INT *)0x0) {
              local_f0 = (REF_INT *)0x0;
            }
            else {
              free(pRVar11);
            }
          }
        } while (local_10c != local_ac);
LAB_0015b48c:
        free(local_e8);
        uVar2 = ref_migrate_shufflin_cell(ref_node,local_98);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x259,"ref_part_meshb_cell",(ulong)uVar2,"fill ghosts");
          return uVar2;
        }
        return 0;
      }
      if (iVar18 < 0) {
        pcVar21 = "malloc elements_to_send of REF_INT negative";
        uVar17 = 0x1b7;
        goto LAB_0015b502;
      }
      sVar19 = (long)iVar18 << 2;
      puVar7 = (uint *)malloc(sVar19);
      if (puVar7 == (uint *)0x0) {
        pcVar21 = "malloc elements_to_send of REF_INT NULL";
        uVar17 = 0x1b7;
      }
      else {
        local_d0 = puVar7;
        piVar8 = (int *)malloc(sVar19);
        if (piVar8 == (int *)0x0) {
          pcVar21 = "malloc start_to_send of REF_INT NULL";
          uVar17 = 0x1b8;
        }
        else {
          local_f8 = (long *)malloc(sVar29);
          if (local_f8 == (long *)0x0) {
            pcVar21 = "malloc c2n of REF_GLOB NULL";
            uVar17 = 0x1b9;
          }
          else {
            local_a0 = (ulong)(int)uVar1;
            local_88 = local_a0 + 1;
            uVar28 = (uint)local_60;
            uVar2 = (int)local_88 * uVar28;
            if ((int)uVar2 < 0) {
              pcVar21 = "malloc c2n_int of REF_INT negative";
              uVar17 = 0x1ba;
              goto LAB_0015b502;
            }
            local_108 = piVar8;
            pvVar9 = malloc((ulong)uVar2 * 4);
            if (pvVar9 == (void *)0x0) {
              pcVar21 = "malloc c2n_int of REF_INT NULL";
              uVar17 = 0x1ba;
            }
            else {
              local_c8 = pvVar9;
              local_90 = malloc((ulong)uVar2 << 3);
              if (local_90 == (void *)0x0) {
                pcVar21 = "malloc c2n_long of REF_LONG NULL";
                uVar17 = 0x1bb;
              }
              else {
                if ((int)uVar28 < 0) {
                  pcVar21 = "malloc dest of REF_INT negative";
                  uVar17 = 0x1bc;
                  goto LAB_0015b502;
                }
                pvVar9 = malloc((ulong)(uVar28 & 0x7fffffff) << 2);
                uVar22 = local_e0;
                if (pvVar9 != (void *)0x0) {
                  puVar7 = local_d0;
                  if (0 < local_68) {
                    local_f0 = (REF_INT *)(nnode + -1);
                    local_70 = local_100 * 8;
                    uVar14 = local_a0 & 0xffffffff;
                    local_48 = local_a0 * 4;
                    local_80 = local_88 << 2;
                    local_58 = local_f8 + 4;
                    local_40 = local_e0 * 4;
                    lVar25 = 0;
                    uVar3 = local_100;
                    local_d8 = pvVar9;
                    local_78 = pad;
                    do {
                      uVar2 = (int)local_68 - (int)lVar25;
                      uVar13 = (ulong)uVar2;
                      if ((int)local_60 < (int)uVar2) {
                        uVar13 = local_60 & 0xffffffff;
                      }
                      iVar18 = (int)uVar13;
                      local_50 = lVar25;
                      if (local_78 == 0) {
                        sVar29 = (size_t)(iVar18 * (int)local_88);
                        if (local_74 < 4) {
                          sVar19 = fread(local_c8,4,sVar29,(FILE *)file);
                          if (sVar19 != sVar29) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x1d5,"ref_part_meshb_cell","int c2n",sVar29,sVar19);
                            return 1;
                          }
                          if (0 < iVar18) {
                            uVar15 = 0;
                            pvVar9 = local_c8;
                            plVar10 = local_f8;
                            do {
                              if (0 < (int)uVar3) {
                                uVar20 = 0;
                                do {
                                  plVar10[uVar20] = (long)*(int *)((long)pvVar9 + uVar20 * 4);
                                  uVar20 = uVar20 + 1;
                                } while (uVar3 != uVar20);
                              }
                              uVar15 = uVar15 + 1;
                              plVar10 = plVar10 + uVar22;
                              pvVar9 = (void *)((long)pvVar9 + local_80);
                            } while (uVar15 != uVar13);
                          }
                        }
                        else {
                          sVar19 = fread(local_90,8,sVar29,(FILE *)file);
                          if (sVar19 != sVar29) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x1dc,"ref_part_meshb_cell","long c2n",sVar29,sVar19);
                            return 1;
                          }
                          if (0 < iVar18) {
                            uVar20 = 0;
                            iVar27 = 0;
                            uVar3 = local_e0;
                            uVar15 = uVar13;
                            do {
                              if (0 < (int)local_100) {
                                memcpy(local_f8 + uVar20,(void *)((long)local_90 + (long)iVar27 * 8)
                                       ,local_70);
                                uVar3 = local_e0;
                              }
                              iVar27 = iVar27 + (int)local_88;
                              uVar20 = (ulong)(uint)((int)uVar20 + (int)uVar3);
                              uVar15 = uVar15 - 1;
                            } while (uVar15 != 0);
                          }
                        }
                      }
                      else {
                        uVar15 = uVar13;
                        pvVar9 = local_c8;
                        if (0 < iVar18) {
                          do {
                            uVar3 = local_a0;
                            local_c0 = uVar15;
                            sVar29 = fread(pvVar9,4,local_a0,(FILE *)file);
                            if (sVar29 == uVar3) {
                              sVar29 = fread(local_34,4,1,(FILE *)file);
                              if (sVar29 != 1) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,0x1c9,"ref_part_meshb_cell","int c2n pad zero",1,sVar29);
                                goto LAB_0015b889;
                              }
                              sVar29 = fread((void *)((long)pvVar9 + local_48),4,1,(FILE *)file);
                              bVar31 = sVar29 == 1;
                              if (!bVar31) {
                                bVar31 = false;
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,0x1cd,"ref_part_meshb_cell","int c2n pad tag",1,sVar29);
                                pad = 1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x1c8,"ref_part_meshb_cell","int c2n pad node",uVar3,sVar29);
LAB_0015b889:
                              pad = 1;
                              bVar31 = false;
                            }
                            if (!bVar31) {
                              return pad;
                            }
                            uVar15 = local_c0 - 1;
                            uVar3 = local_100;
                            pvVar9 = (void *)((long)pvVar9 + local_80);
                          } while (local_c0 - 1 != 0);
                        }
                        if (0 < iVar18) {
                          uVar15 = 0;
                          pvVar9 = local_c8;
                          plVar10 = local_f8;
                          do {
                            if (0 < (int)uVar3) {
                              uVar20 = 0;
                              do {
                                plVar10[uVar20] = (long)*(int *)((long)pvVar9 + uVar20 * 4);
                                uVar20 = uVar20 + 1;
                              } while (uVar3 != uVar20);
                            }
                            uVar15 = uVar15 + 1;
                            plVar10 = plVar10 + uVar22;
                            pvVar9 = (void *)((long)pvVar9 + local_80);
                          } while (uVar15 != uVar13);
                        }
                      }
                      if (0 < iVar18) {
                        uVar3 = 0;
                        plVar10 = local_f8;
                        do {
                          if (0 < (int)uVar1) {
                            uVar15 = 0;
                            do {
                              plVar10[uVar15] = plVar10[uVar15] + -1;
                              uVar15 = uVar15 + 1;
                            } while (uVar14 != uVar15);
                          }
                          uVar3 = uVar3 + 1;
                          plVar10 = plVar10 + uVar22;
                        } while (uVar3 != uVar13);
                      }
                      if ((local_98->type == REF_CELL_PYR) &&
                         (uVar3 = uVar13, plVar10 = local_58, 0 < iVar18)) {
                        do {
                          lVar25 = plVar10[-1];
                          lVar4 = *plVar10;
                          plVar10[-1] = plVar10[-3];
                          *plVar10 = plVar10[-2];
                          plVar10[-3] = lVar25;
                          plVar10[-2] = lVar4;
                          uVar3 = uVar3 - 1;
                          plVar10 = plVar10 + uVar22;
                        } while (uVar3 != 0);
                      }
                      if (0 < iVar18) {
                        lVar4 = (long)ref_mpi->n;
                        lVar25 = ((long)local_f0 + lVar4) / lVar4;
                        lVar5 = nnode - ((long)local_f0 / lVar4) * lVar4;
                        uVar3 = 0;
                        plVar10 = local_f8;
                        do {
                          lVar6 = *plVar10 / lVar25;
                          if (lVar5 <= lVar6) {
                            lVar6 = (*plVar10 - lVar25 * lVar5) / ((long)local_f0 / lVar4) + lVar5;
                          }
                          *(int *)((long)local_d8 + uVar3 * 4) = (int)lVar6;
                          uVar3 = uVar3 + 1;
                          plVar10 = plVar10 + uVar22;
                        } while (uVar13 != uVar3);
                      }
                      if (0 < ref_mpi->n) {
                        lVar25 = 0;
                        do {
                          local_d0[lVar25] = 0;
                          lVar25 = lVar25 + 1;
                        } while (lVar25 < ref_mpi->n);
                      }
                      if (0 < iVar18) {
                        uVar3 = 0;
                        do {
                          local_d0[*(int *)((long)local_d8 + uVar3 * 4)] =
                               local_d0[*(int *)((long)local_d8 + uVar3 * 4)] + 1;
                          uVar3 = uVar3 + 1;
                        } while (uVar13 != uVar3);
                      }
                      *local_108 = 0;
                      iVar27 = ref_mpi->n;
                      if (1 < (long)iVar27) {
                        iVar12 = *local_108;
                        lVar25 = 0;
                        do {
                          iVar12 = iVar12 + local_d0[lVar25];
                          local_108[lVar25 + 1] = iVar12;
                          lVar25 = lVar25 + 1;
                        } while ((long)iVar27 + -1 != lVar25);
                      }
                      if (0 < ref_mpi->n) {
                        lVar25 = 0;
                        do {
                          local_d0[lVar25] = 0;
                          lVar25 = lVar25 + 1;
                        } while (lVar25 < ref_mpi->n);
                      }
                      iVar27 = (int)local_e0;
                      puVar7 = local_d0;
                      pvVar9 = local_d8;
                      if (0 < iVar18) {
                        uVar20 = 0;
                        uVar15 = 0;
                        uVar3 = local_e0;
                        do {
                          uVar16 = (ulong)*(int *)((long)pvVar9 + uVar15 * 4);
                          uVar2 = puVar7[uVar16];
                          if (0 < (int)uVar3) {
                            local_c0 = uVar16;
                            memcpy(local_e8 + (int)((local_108[uVar16] + uVar2) * (int)local_100),
                                   local_f8 + uVar20,local_70);
                            uVar3 = local_e0;
                            uVar16 = local_c0;
                            puVar7 = local_d0;
                            pvVar9 = local_d8;
                          }
                          puVar7[uVar16] = uVar2 + 1;
                          uVar15 = uVar15 + 1;
                          iVar27 = (int)uVar3;
                          uVar20 = (ulong)(uint)((int)uVar20 + iVar27);
                        } while (uVar13 != uVar15);
                      }
                      uVar2 = *puVar7;
                      if (0 < (int)uVar2) {
                        uVar28 = uVar2 * iVar27;
                        uVar3 = (ulong)uVar28;
                        if ((int)uVar28 < 0) {
                          bVar31 = false;
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x215,"ref_part_meshb_cell","malloc sent_part of REF_INT negative"
                                );
                          pad = 1;
                        }
                        else {
                          pRVar11 = (REF_INT *)malloc(uVar3 << 2);
                          if (pRVar11 == (REF_INT *)0x0) {
                            bVar31 = false;
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x215,"ref_part_meshb_cell","malloc sent_part of REF_INT NULL");
                            pad = 2;
                            local_a8 = (REF_INT *)0x0;
                          }
                          else {
                            if (local_100 != 0) {
                              if ((int)uVar28 < 2) {
                                uVar3 = 1;
                              }
                              memset(pRVar11,0xff,uVar3 << 2);
                            }
                            bVar31 = true;
                            local_a8 = pRVar11;
                          }
                        }
                        if (!bVar31) {
                          return pad;
                        }
                        local_c0 = CONCAT44(local_c0._4_4_,uVar2);
                        uVar3 = 1;
                        if (1 < (int)uVar2) {
                          uVar3 = (ulong)uVar2;
                        }
                        uVar13 = 0;
                        pRVar11 = local_a8;
                        pRVar24 = local_e8;
                        do {
                          if (0 < (int)local_a0) {
                            uVar15 = 0;
                            do {
                              lVar6 = (long)ref_mpi->n;
                              lVar25 = ((long)local_f0 + lVar6) / lVar6;
                              lVar4 = pRVar24[uVar15] / lVar25;
                              lVar5 = nnode - lVar6 * ((long)local_f0 / lVar6);
                              if (lVar5 <= lVar4) {
                                lVar4 = (pRVar24[uVar15] - lVar25 * lVar5) /
                                        ((long)local_f0 / lVar6) + lVar5;
                              }
                              pRVar11[uVar15] = (REF_INT)lVar4;
                              uVar15 = uVar15 + 1;
                            } while (uVar14 != uVar15);
                          }
                          uVar13 = uVar13 + 1;
                          pRVar24 = pRVar24 + uVar22;
                          pRVar11 = (REF_INT *)((long)pRVar11 + local_40);
                        } while (uVar13 != uVar3);
                        uVar2 = ref_cell_add_many_global
                                          (local_98,ref_node,uVar2,local_e8,local_a8,ref_mpi->id);
                        if (uVar2 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x21e,"ref_part_meshb_cell",(ulong)uVar2,"glob");
                          return uVar2;
                        }
                        if (local_a8 == (REF_INT *)0x0) {
                          local_a8 = (REF_INT *)0x0;
                          puVar7 = local_d0;
                          pvVar9 = local_d8;
                        }
                        else {
                          free(local_a8);
                          puVar7 = local_d0;
                          pvVar9 = local_d8;
                        }
                      }
                      uVar3 = local_100;
                      if (1 < ref_mpi->n) {
                        lVar4 = 1;
                        lVar25 = 4;
                        do {
                          if (0 < (int)puVar7[lVar4]) {
                            uVar2 = ref_mpi_scatter_send
                                              (ref_mpi,(void *)((long)puVar7 + lVar25),1,1,
                                               (REF_INT)lVar4);
                            if (uVar2 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x227,"ref_part_meshb_cell",(ulong)uVar2,"send");
                              return uVar2;
                            }
                            uVar2 = ref_mpi_scatter_send
                                              (ref_mpi,local_e8 +
                                                       (long)local_108[lVar4] * (long)(int)uVar3,
                                               (int)uVar3 * local_d0[lVar4],2,(REF_INT)lVar4);
                            puVar7 = local_d0;
                            pvVar9 = local_d8;
                            if (uVar2 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x22b,"ref_part_meshb_cell",(ulong)uVar2,"send");
                              return uVar2;
                            }
                          }
                          lVar4 = lVar4 + 1;
                          lVar25 = lVar25 + 4;
                        } while (lVar4 < ref_mpi->n);
                      }
                      lVar25 = local_50 + iVar18;
                    } while (lVar25 < local_68);
                  }
                  free(pvVar9);
                  free(local_90);
                  free(local_c8);
                  free(local_f8);
                  free(local_108);
                  free(puVar7);
                  if (1 < ref_mpi->n) {
                    iVar18 = 1;
                    do {
                      uVar2 = ref_mpi_scatter_send(ref_mpi,&local_ac,1,1,iVar18);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x23a,"ref_part_meshb_cell",(ulong)uVar2,"send");
                        return uVar2;
                      }
                      iVar18 = iVar18 + 1;
                      ref_node = local_b8;
                    } while (iVar18 < ref_mpi->n);
                  }
                  goto LAB_0015b48c;
                }
                pcVar21 = "malloc dest of REF_INT NULL";
                uVar17 = 0x1bc;
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17,
           "ref_part_meshb_cell",pcVar21);
    RVar26 = 2;
  }
  return RVar26;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_cell(REF_CELL ref_cell, REF_LONG ncell,
                                              REF_NODE ref_node, REF_LONG nnode,
                                              REF_INT version, REF_BOOL pad,
                                              FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_LONG ncell_read;
  REF_INT chunk;
  REF_INT end_of_message = REF_EMPTY;
  REF_INT elements_to_receive;
  REF_GLOB *c2n;
  REF_INT *c2n_int;
  REF_LONG *c2n_long;
  REF_GLOB *sent_c2n;
  REF_INT *dest;
  REF_INT *sent_part;
  REF_INT *elements_to_send;
  REF_INT *start_to_send;
  REF_INT node_per, size_per;
  REF_INT section_size;
  REF_INT cell;
  REF_INT part, node;
  REF_INT ncell_keep;
  REF_INT new_location;
  size_t nread;

  chunk = (REF_INT)MAX(1000000, ncell / (REF_LONG)ref_mpi_n(ref_mpi));

  node_per = ref_cell_node_per(ref_cell);
  size_per = ref_cell_size_per(ref_cell);

  ref_malloc(sent_c2n, size_per * chunk, REF_GLOB);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(elements_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(c2n, size_per * chunk, REF_GLOB);
    ref_malloc(c2n_int, (node_per + 1) * chunk, REF_INT);
    ref_malloc(c2n_long, (node_per + 1) * chunk, REF_LONG);
    ref_malloc(dest, chunk, REF_INT);

    ncell_read = 0;
    while (ncell_read < ncell) {
      section_size = MIN(chunk, (REF_INT)(ncell - ncell_read));
      nread = (size_t)(section_size * (1 + node_per));
      if (pad) {
        for (cell = 0; cell < section_size; cell++) {
          REF_INT zero;
          REIS(node_per,
               fread(&(c2n_int[(node_per + 1) * cell]), sizeof(REF_INT),
                     (size_t)node_per, file),
               "int c2n pad node");
          REIS(1, fread(&(zero), sizeof(REF_INT), 1, file), "int c2n pad zero");
          REIS(1,
               fread(&(c2n_int[node_per + (node_per + 1) * cell]),
                     sizeof(REF_INT), 1, file),
               "int c2n pad tag");
        }
        for (cell = 0; cell < section_size; cell++)
          for (node = 0; node < size_per; node++)
            c2n[node + size_per * cell] =
                (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
      } else {
        if (version < 4) {
          REIS(nread, fread(c2n_int, sizeof(REF_INT), nread, file), "int c2n");
          for (cell = 0; cell < section_size; cell++)
            for (node = 0; node < size_per; node++)
              c2n[node + size_per * cell] =
                  (REF_GLOB)c2n_int[node + (node_per + 1) * cell];
        } else {
          REIS(nread, fread(c2n_long, sizeof(REF_LONG), nread, file),
               "long c2n");
          for (cell = 0; cell < section_size; cell++)
            for (node = 0; node < size_per; node++)
              c2n[node + size_per * cell] =
                  (REF_GLOB)c2n_long[node + (node_per + 1) * cell];
        }
      }
      for (cell = 0; cell < section_size; cell++)
        for (node = 0; node < node_per; node++) c2n[node + size_per * cell]--;

      if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
        REF_GLOB n0, n1, n2, n3, n4;
        /* convention: square basis is 0-1-2-3
           (oriented counter clockwise like trias) and top vertex is 4 */
        for (cell = 0; cell < section_size; cell++) {
          n0 = c2n[0 + size_per * cell];
          n1 = c2n[1 + size_per * cell];
          n2 = c2n[2 + size_per * cell];
          n3 = c2n[3 + size_per * cell];
          n4 = c2n[4 + size_per * cell];
          c2n[0 + size_per * cell] = n0;
          c2n[3 + size_per * cell] = n1;
          c2n[4 + size_per * cell] = n2;
          c2n[1 + size_per * cell] = n3;
          c2n[2 + size_per * cell] = n4;
        }
      }

      ncell_read += section_size;

      for (cell = 0; cell < section_size; cell++)
        dest[cell] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), c2n[size_per * cell]);

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++)
        elements_to_send[dest[cell]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] =
            start_to_send[part - 1] + elements_to_send[part - 1];
      }

      each_ref_mpi_part(ref_mpi, part) elements_to_send[part] = 0;
      for (cell = 0; cell < section_size; cell++) {
        new_location = start_to_send[dest[cell]] + elements_to_send[dest[cell]];
        for (node = 0; node < size_per; node++)
          sent_c2n[node + size_per * new_location] =
              c2n[node + size_per * cell];
        elements_to_send[dest[cell]]++;
      }

      /* rank 0 keepers */

      ncell_keep = elements_to_send[0];
      if (0 < ncell_keep) {
        ref_malloc_init(sent_part, size_per * ncell_keep, REF_INT, REF_EMPTY);

        for (cell = 0; cell < ncell_keep; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, ncell_keep, sent_c2n,
                                     sent_part, ref_mpi_rank(ref_mpi)),
            "glob");

        ref_free(sent_part);
      }

      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < elements_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(elements_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(
                  ref_mpi, &(sent_c2n[size_per * start_to_send[part]]),
                  size_per * elements_to_send[part], REF_GLOB_TYPE, part),
              "send");
        }
      }
    }

    ref_free(dest);
    ref_free(c2n_long);
    ref_free(c2n_int);
    ref_free(c2n);
    ref_free(start_to_send);
    ref_free(elements_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      RSS(ref_mpi_scatter_recv(ref_mpi, &elements_to_receive, 1, REF_INT_TYPE),
          "recv");
      if (elements_to_receive > 0) {
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_c2n,
                                 size_per * elements_to_receive, REF_GLOB_TYPE),
            "send");

        ref_malloc_init(sent_part, size_per * elements_to_receive, REF_INT,
                        REF_EMPTY);

        for (cell = 0; cell < elements_to_receive; cell++)
          for (node = 0; node < node_per; node++)
            sent_part[node + size_per * cell] = ref_part_implicit(
                nnode, ref_mpi_n(ref_mpi), sent_c2n[node + size_per * cell]);

        RSS(ref_cell_add_many_global(ref_cell, ref_node, elements_to_receive,
                                     sent_c2n, sent_part,
                                     ref_mpi_rank(ref_mpi)),
            "many glob");

        ref_free(sent_part);
      }
    } while (elements_to_receive != end_of_message);
  }

  free(sent_c2n);

  RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "fill ghosts");

  return REF_SUCCESS;
}